

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

void __thiscall cmFindLibraryHelper::AddName(cmFindLibraryHelper *this,string *name)

{
  cmFindLibraryHelper *this_00;
  string regex;
  Name entry;
  undefined1 local_190 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined1 local_118 [208];
  cmAlphaNum local_48;
  
  local_138._M_allocated_capacity = (size_type)&local_128;
  local_140[0] = false;
  local_138._8_8_ = 0;
  local_128._M_local_buf[0] = '\0';
  local_118._176_8_ = (char *)0x0;
  local_118._192_8_ = (char *)0x0;
  local_118._200_4_ = 0;
  memset((RegularExpression *)local_118,0,0xaa);
  local_140[0] = HasValidSuffix(this,name);
  std::__cxx11::string::_M_assign((string *)(local_140 + 8));
  local_168 = &local_160;
  local_190._32_8_ = (pointer)0x1;
  local_160._M_dataplus._M_p._0_1_ = 0x5e;
  local_48.View_._M_str = (this->PrefixRegexStr)._M_dataplus._M_p;
  local_48.View_._M_len = (this->PrefixRegexStr)._M_string_length;
  this_00 = (cmFindLibraryHelper *)local_190;
  cmStrCat<>((string *)this_00,(cmAlphaNum *)(local_190 + 0x20),&local_48);
  RegexFromLiteral(this_00,(string *)local_190,name);
  std::__cxx11::string::append((string *)local_190);
  if (this->OpenBSD == true) {
    std::__cxx11::string::append(local_190);
  }
  std::__cxx11::string::append(local_190);
  cmsys::RegularExpression::compile((RegularExpression *)local_118,(char *)local_190._0_8_);
  std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::
  emplace_back<cmFindLibraryHelper::Name>(&this->Names,(Name *)local_140);
  std::__cxx11::string::~string((string *)local_190);
  Name::~Name((Name *)local_140);
  return;
}

Assistant:

void cmFindLibraryHelper::AddName(std::string const& name)
{
  Name entry;

  // Consider checking the raw name too.
  entry.TryRaw = this->HasValidSuffix(name);
  entry.Raw = name;

  // Build a regular expression to match library names.
  std::string regex = cmStrCat('^', this->PrefixRegexStr);
  this->RegexFromLiteral(regex, name);
  regex += this->SuffixRegexStr;
  if (this->OpenBSD) {
    regex += "(\\.[0-9]+\\.[0-9]+)?";
  }
  regex += "$";
  entry.Regex.compile(regex);
  this->Names.push_back(std::move(entry));
}